

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermBranch * __thiscall
glslang::TIntermediate::addBranch
          (TIntermediate *this,TOperator branchOp,TIntermTyped *expression,TSourceLoc *loc)

{
  TIntermBranch *this_00;
  undefined4 in_register_00000034;
  
  this_00 = (TIntermBranch *)
            TIntermNode::operator_new((TIntermNode *)0x30,CONCAT44(in_register_00000034,branchOp));
  (this_00->super_TIntermNode).loc.name = (TString *)0x0;
  (this_00->super_TIntermNode).loc.string = 0;
  (this_00->super_TIntermNode).loc.line = 0;
  (this_00->super_TIntermNode).loc.column = 0;
  (this_00->super_TIntermNode)._vptr_TIntermNode = (_func_int **)&PTR_getLoc_00a615c8;
  this_00->flowOp = branchOp;
  this_00->expression = expression;
  TIntermNode::setLoc((TIntermNode *)this_00,loc);
  return this_00;
}

Assistant:

TIntermBranch* TIntermediate::addBranch(TOperator branchOp, TIntermTyped* expression, const TSourceLoc& loc)
{
    TIntermBranch* node = new TIntermBranch(branchOp, expression);
    node->setLoc(loc);

    return node;
}